

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

int tsbp::parseLine(char *line)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *local_20;
  char *p;
  int i;
  char *line_local;
  
  sVar3 = strlen(line);
  local_20 = line;
  while( true ) {
    bVar1 = true;
    if ('/' < *local_20) {
      bVar1 = '9' < *local_20;
    }
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  line[(int)sVar3 + -3] = '\0';
  iVar2 = atoi(local_20);
  return iVar2;
}

Assistant:

int parseLine(char* line)
    {
        // This assumes that a digit will be found and the line ends in " Kb".
        int i = strlen(line);
        const char* p = line;
        while (*p < '0' || *p > '9')
            p++;

        line[i - 3] = '\0';
        i = atoi(p);

        return i;
    }